

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

Status * __thiscall
draco::PlyReader::ParseHeader(Status *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Status *pSVar3;
  long lVar4;
  StatusOr<bool> _statusor85;
  StatusOr<bool> _statusor78;
  StatusOr<bool> local_90;
  StatusOr<bool> local_60;
  
  paVar1 = &(__return_storage_ptr__->error_msg_).field_2;
  ParseEndHeader(&local_60,this,buffer);
  if (local_60.status_.code_ == OK) {
    lVar4 = 3;
    if (local_60.value_ == false) {
      bVar2 = ParseElement(this,buffer);
      lVar4 = 2;
      if (!bVar2) {
        ParseProperty(&local_90,this,buffer);
        if (local_90.status_.code_ == OK) {
          lVar4 = 2;
          if (local_90.value_ == false) {
            lVar4 = 0;
            parser::SkipLine(buffer);
          }
        }
        else {
          __return_storage_ptr__->code_ = local_90.status_.code_;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
          lVar4 = 1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->error_msg_,
                     local_90.status_.error_msg_._M_dataplus._M_p,
                     local_90.status_.error_msg_._M_dataplus._M_p +
                     local_90.status_.error_msg_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.status_.error_msg_._M_dataplus._M_p != &local_90.status_.error_msg_.field_2)
        {
          operator_delete(local_90.status_.error_msg_._M_dataplus._M_p,
                          local_90.status_.error_msg_.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    __return_storage_ptr__->code_ = local_60.status_.code_;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)paVar1;
    lVar4 = 1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,
               local_60.status_.error_msg_._M_dataplus._M_p,
               local_60.status_.error_msg_._M_dataplus._M_p +
               local_60.status_.error_msg_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.status_.error_msg_._M_dataplus._M_p != &local_60.status_.error_msg_.field_2) {
    operator_delete(local_60.status_.error_msg_._M_dataplus._M_p,
                    local_60.status_.error_msg_.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = (Status *)(*(code *)(&DAT_001a3798 + *(int *)(&DAT_001a3798 + lVar4 * 4)))();
  return pSVar3;
}

Assistant:

Status PlyReader::ParseHeader(DecoderBuffer *buffer) {
  while (true) {
    DRACO_ASSIGN_OR_RETURN(bool end, ParseEndHeader(buffer));
    if (end) {
      break;
    }
    if (ParseElement(buffer)) {
      continue;
    }
    DRACO_ASSIGN_OR_RETURN(bool property_parsed, ParseProperty(buffer));
    if (property_parsed) {
      continue;
    }
    parser::SkipLine(buffer);
  }
  return OkStatus();
}